

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::CacheEntry::RemoveProperty(CacheEntry *this,string *prop)

{
  int iVar1;
  CacheEntryType CVar2;
  string local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"STRING","");
    CVar2 = cmState::StringToCacheEntryType(&local_38);
    this->Type = CVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)prop);
    if (iVar1 != 0) {
      cmPropertyMap::RemoveProperty(&this->Properties,prop);
      return;
    }
    (this->Value)._M_string_length = 0;
    *(this->Value)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::RemoveProperty(const std::string& prop)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType("STRING");
  } else if (prop == "VALUE") {
    this->Value.clear();
  } else {
    this->Properties.RemoveProperty(prop);
  }
}